

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

void fy_emit_mapping_epilog(fy_emitter *emit,fy_emit_save_ctx *sc)

{
  fy_emitter_cfg_flags fVar1;
  
  fVar1 = emit->cfg->flags;
  if (((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x2) != (undefined1  [40])0x0)
     || ((fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE)) {
    if (((fVar1 & 0xf00000) != FYECF_MODE_FLOW_ONELINE) &&
       (((fVar1 & 0xf00000) != FYECF_MODE_JSON_ONELINE &&
        ((undefined1  [40])((undefined1  [40])*sc & (undefined1  [40])0x4) == (undefined1  [40])0x0)
        ))) {
      fy_emit_write_indent(emit,sc->old_indent);
    }
    emit->flow_level = emit->flow_level + -1;
    fy_emit_putc(emit,fyewt_indicator,0x7d);
    *(byte *)&emit->flags = (byte)emit->flags & 0xf8;
  }
  return;
}

Assistant:

static void fy_emit_mapping_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc) {
    if (sc->flow || fy_emit_is_json_mode(emit)) {
        if (!fy_emit_is_oneline(emit) && !sc->empty)
            fy_emit_write_indent(emit, sc->old_indent);
        fy_emit_write_indicator(emit, di_right_brace, sc->flags, sc->old_indent, fyewt_indicator);
    }
}